

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

XmlWriter * __thiscall
doctest::anon_unknown_14::XmlWriter::writeAttribute(XmlWriter *this,string *name,char *attribute)

{
  ostream *poVar1;
  allocator local_69;
  XmlEncode local_68;
  string local_40 [32];
  
  if (((attribute != (char *)0x0) && (name->_M_string_length != 0)) && (*attribute != '\0')) {
    poVar1 = std::operator<<(this->m_os,' ');
    poVar1 = std::operator<<(poVar1,(string *)name);
    poVar1 = std::operator<<(poVar1,"=\"");
    std::__cxx11::string::string(local_40,attribute,&local_69);
    std::__cxx11::string::string((string *)&local_68,local_40);
    local_68.m_forWhat = ForAttributes;
    operator<<(poVar1,&local_68);
    std::operator<<(poVar1,'\"');
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string(local_40);
  }
  return this;
}

Assistant:

XmlWriter& XmlWriter::writeAttribute( std::string const& name, const char* attribute ) {
        if( !name.empty() && attribute && attribute[0] != '\0' )
            m_os << ' ' << name << "=\"" << XmlEncode( attribute, XmlEncode::ForAttributes ) << '"';
        return *this;
    }